

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTools.cpp
# Opt level: O2

string * StringTools::urlEncode
                   (string *__return_storage_ptr__,string *value,string *additionalLegitChars)

{
  pointer pcVar1;
  size_type sVar2;
  int iVar3;
  long lVar4;
  ostream *poVar5;
  size_type sVar6;
  stringstream ss;
  ostream local_1a8 [376];
  
  if (urlEncode(std::__cxx11::string_const&,std::__cxx11::string_const&)::
      legitPunctuation_abi_cxx11_ == '\0') {
    iVar3 = __cxa_guard_acquire(&urlEncode(std::__cxx11::string_const&,std::__cxx11::string_const&)
                                 ::legitPunctuation_abi_cxx11_);
    if (iVar3 != 0) {
      std::__cxx11::string::string
                ((string *)
                 &urlEncode(std::__cxx11::string_const&,std::__cxx11::string_const&)::
                  legitPunctuation_abi_cxx11_,
                 "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789_.-~:",
                 (allocator *)&ss);
      __cxa_atexit(std::__cxx11::string::~string,
                   &urlEncode(std::__cxx11::string_const&,std::__cxx11::string_const&)::
                    legitPunctuation_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&urlEncode(std::__cxx11::string_const&,std::__cxx11::string_const&)::
                           legitPunctuation_abi_cxx11_);
    }
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  pcVar1 = (value->_M_dataplus)._M_p;
  sVar2 = value->_M_string_length;
  sVar6 = 0;
  do {
    if (sVar2 == sVar6) {
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      return __return_storage_ptr__;
    }
    lVar4 = std::__cxx11::string::find(-0x28,(ulong)(uint)(int)pcVar1[sVar6]);
    if (lVar4 == -1) {
      lVar4 = std::__cxx11::string::find((char)additionalLegitChars,(ulong)(uint)(int)pcVar1[sVar6])
      ;
      if (lVar4 != -1) goto LAB_0020cc96;
      poVar5 = std::operator<<(local_1a8,'%');
      *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
           *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) | 0x4000;
      poVar5 = std::operator<<(poVar5,0x30);
      lVar4 = *(long *)poVar5;
      *(undefined8 *)(poVar5 + *(long *)(lVar4 + -0x18) + 0x10) = 2;
      lVar4 = *(long *)(lVar4 + -0x18);
      *(uint *)(poVar5 + lVar4 + 0x18) = *(uint *)(poVar5 + lVar4 + 0x18) & 0xffffffb5 | 8;
      std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    }
    else {
LAB_0020cc96:
      std::operator<<(local_1a8,pcVar1[sVar6]);
    }
    sVar6 = sVar6 + 1;
  } while( true );
}

Assistant:

string urlEncode(const string& value, const std::string& additionalLegitChars) {
    static const string legitPunctuation = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789_.-~:";
    std::stringstream ss;
    for (auto const &c : value) {
        if ((legitPunctuation.find(c) == std::string::npos) && (additionalLegitChars.find(c) == std::string::npos)) {
            ss << '%' << std::uppercase << std::setfill('0') << std::setw(2) << std::hex << (unsigned int)(unsigned char)c;
        } else {
            ss << c;
        }
    }

    return ss.str();
}